

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerdisplay.cpp
# Opt level: O2

void __thiscall FListMenuItemPlayerDisplay::Drawer(FListMenuItemPlayerDisplay *this,bool selected)

{
  double dVar1;
  double dVar2;
  FState *pFVar3;
  BYTE *pBVar4;
  long lVar5;
  bool bVar6;
  FTextureID texnum;
  FTexture *pFVar7;
  DVector2 *pDVar8;
  double *pdVar9;
  long lVar10;
  int left;
  FRemapTable *pFVar11;
  int iVar12;
  int iVar13;
  spriteframe_t *psVar14;
  FString portrait;
  
  if ((this->mMode == '\0') && (bVar6 = UpdatePlayerClass(this), !bVar6)) {
    return;
  }
  FString::AttachToOther(&portrait,&this->mPlayerClass->Type->Portrait);
  if ((((*(int *)(portrait.Chars + -0xc) == 0) || (this->mNoportrait != false)) ||
      (texnum = FTextureManager::CheckForTexture(&TexMan,portrait.Chars,8,1), texnum.texnum < 1)) ||
     (pFVar7 = FTextureManager::operator()(&TexMan,texnum,false), pFVar7 == (FTexture *)0x0)) {
    left = ((screen->super_DSimpleCanvas).super_DCanvas.Width >> 1) +
           ((this->super_FListMenuItem).mXpos + -0xa0) * CleanXfac;
    iVar13 = ((this->super_FListMenuItem).mYpos + -100) * CleanYfac;
    iVar12 = (screen->super_DSimpleCanvas).super_DCanvas.Height >> 1;
    DCanvas::DrawTexture
              ((DCanvas *)screen,this->mBackdrop,(double)left,(double)(iVar12 + iVar13 + -1),
               0x40001389,(ulong)(uint)(CleanXfac * 0x48),0x4000138a,(ulong)(uint)(CleanYfac * 0x50)
               ,0x4000138e,&this->mRemap,0x400013a5,1,0);
    iVar12 = iVar12 + iVar13;
    V_DrawFrame(left,iVar12,CleanXfac * 0x48,CleanYfac * 0x50 + -1);
    pFVar3 = this->mPlayerState;
    if (pFVar3 != (FState *)0x0) {
      lVar10 = (long)this->mSkin;
      if (lVar10 == 0) {
        lVar5 = (ulong)pFVar3->Frame + (ulong)sprites.Array[pFVar3->sprite].spriteframes;
        pBVar4 = (this->mPlayerClass->Type->super_PClassActor).super_PClass.Defaults;
        pDVar8 = (DVector2 *)(pBVar4 + 0xf8);
        pdVar9 = (double *)(pBVar4 + 0x100);
      }
      else {
        pDVar8 = &skins[lVar10].Scale;
        lVar5 = (ulong)pFVar3->Frame + (ulong)sprites.Array[skins[lVar10].sprite].spriteframes;
        pdVar9 = &skins[lVar10].Scale.Y;
      }
      psVar14 = SpriteFrames.Array + lVar5;
      if (psVar14 != (spriteframe_t *)0x0) {
        dVar1 = pDVar8->X;
        dVar2 = *pdVar9;
        pFVar7 = FTextureManager::operator()
                           (&TexMan,(FTextureID)psVar14->Texture[this->mRotation].texnum,false);
        if ((pFVar7 != (FTexture *)0x0) && (pFVar7->UseType != '\r')) {
          if (this->mTranslate == '\0') {
            pFVar11 = (FRemapTable *)0x0;
          }
          else {
            pFVar11 = translationtables[1].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[8].Ptr;
          }
          DCanvas::DrawTexture
                    ((DCanvas *)screen,pFVar7,(double)(CleanXfac * 0x24 + left),
                     (double)(CleanYfac * 0x47 + iVar12),0x400013af,
                     (dVar1 * (double)CleanXfac * (double)pFVar7->Width) / (pFVar7->Scale).X,
                     (dVar2 * (double)CleanYfac * (double)pFVar7->Height) / (pFVar7->Scale).Y,
                     0x400013b0,0x4000138e,pFVar11,0x40001395,
                     (ulong)(1 << (this->mRotation & 0x1f) & (uint)psVar14->Flip),0);
        }
      }
    }
  }
  else {
    DCanvas::DrawTexture
              ((DCanvas *)screen,pFVar7,(double)(this->super_FListMenuItem).mXpos,
               (double)(this->super_FListMenuItem).mYpos,0x40001390,1,0);
  }
  FString::~FString(&portrait);
  return;
}

Assistant:

void FListMenuItemPlayerDisplay::Drawer(bool selected)
{
	if (mMode == 0 && !UpdatePlayerClass())
	{
		return;
	}

	FString portrait = mPlayerClass->Type->Portrait;

	if (portrait.IsNotEmpty() && !mNoportrait)
	{
		FTextureID texid = TexMan.CheckForTexture(portrait, FTexture::TEX_MiscPatch);
		if (texid.isValid())
		{
			FTexture *tex = TexMan(texid);
			if (tex != NULL)
			{
				screen->DrawTexture (tex, mXpos, mYpos, DTA_Clean, true, TAG_DONE);
				return;
			}
		}
	}
	int x = (mXpos - 160) * CleanXfac + (SCREENWIDTH>>1);
	int y = (mYpos - 100) * CleanYfac + (SCREENHEIGHT>>1);

	screen->DrawTexture (mBackdrop, x, y - 1,
		DTA_DestWidth, 72 * CleanXfac,
		DTA_DestHeight, 80 * CleanYfac,
		DTA_Translation, &mRemap,
		DTA_Masked, true,
		TAG_DONE);

	V_DrawFrame (x, y, 72*CleanXfac, 80*CleanYfac-1);

	spriteframe_t *sprframe = NULL;
	DVector2 Scale;

	if (mPlayerState != NULL)
	{
		if (mSkin == 0)
		{
			sprframe = &SpriteFrames[sprites[mPlayerState->sprite].spriteframes + mPlayerState->GetFrame()];
			Scale = GetDefaultByType(mPlayerClass->Type)->Scale;
		}
		else
		{
			sprframe = &SpriteFrames[sprites[skins[mSkin].sprite].spriteframes + mPlayerState->GetFrame()];
			Scale = skins[mSkin].Scale;
		}
	}

	if (sprframe != NULL)
	{
		FTexture *tex = TexMan(sprframe->Texture[mRotation]);
		if (tex != NULL && tex->UseType != FTexture::TEX_Null)
		{
			FRemapTable *trans = NULL;
			if (mTranslate) trans = translationtables[TRANSLATION_Players](MAXPLAYERS);
			screen->DrawTexture (tex,
				x + 36*CleanXfac, y + 71*CleanYfac,
				DTA_DestWidthF, tex->GetScaledWidthDouble() * CleanXfac * Scale.X,
				DTA_DestHeightF, tex->GetScaledHeightDouble() * CleanYfac * Scale.Y,
				DTA_Translation, trans,
				DTA_FlipX, sprframe->Flip & (1 << mRotation),
				TAG_DONE);
		}
	}
}